

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool __thiscall
vkb::detail::GenericFeatureChain::match_all
          (GenericFeatureChain *this,GenericFeatureChain *extension_requested)

{
  size_type sVar1;
  size_type sVar2;
  const_reference requested;
  const_reference supported;
  bool bVar3;
  ulong local_28;
  size_t i;
  GenericFeatureChain *extension_requested_local;
  GenericFeatureChain *this_local;
  
  sVar1 = std::
          vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ::size(&extension_requested->nodes);
  sVar2 = std::
          vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ::size(&this->nodes);
  if (sVar1 == sVar2) {
    local_28 = 0;
    while( true ) {
      sVar1 = std::
              vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
              ::size(&extension_requested->nodes);
      bVar3 = false;
      if (local_28 < sVar1) {
        sVar1 = std::
                vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ::size(&this->nodes);
        bVar3 = local_28 < sVar1;
      }
      if (!bVar3) {
        return true;
      }
      requested = std::
                  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                  ::operator[](&extension_requested->nodes,local_28);
      supported = std::
                  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                  ::operator[](&this->nodes,local_28);
      bVar3 = GenericFeaturesPNextNode::match(requested,supported);
      if (!bVar3) break;
      local_28 = local_28 + 1;
    }
  }
  return false;
}

Assistant:

bool GenericFeatureChain::match_all(GenericFeatureChain const& extension_requested) const noexcept {
    // Should only be false if extension_supported was unable to be filled out, due to the
    // physical device not supporting vkGetPhysicalDeviceFeatures2 in any capacity.
    if (extension_requested.nodes.size() != nodes.size()) {
        return false;
    }

    for (size_t i = 0; i < extension_requested.nodes.size() && i < nodes.size(); ++i) {
        if (!GenericFeaturesPNextNode::match(extension_requested.nodes[i], nodes[i])) return false;
    }
    return true;
}